

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_TestEdition_Test::
ParseEditionsTest_TestEdition_Test(ParseEditionsTest_TestEdition_Test *this)

{
  ParseEditionsTest_TestEdition_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseEditionsTest);
  (this->super_ParseEditionsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseEditionsTest_TestEdition_Test_02a11398;
  return;
}

Assistant:

TEST_F(ParseEditionsTest, TestEdition) {
  ExpectParsesTo(
      R"schema(
        edition = "99998_TEST_ONLY";
      )schema",
      "syntax: \"editions\""
      "edition: EDITION_99998_TEST_ONLY\n");
}